

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QHstsPolicy>::emplace<QHstsPolicy>
          (QMovableArrayOps<QHstsPolicy> *this,qsizetype i,QHstsPolicy *args)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  Inserter *in_RDX;
  QHstsPolicy *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QHstsPolicy tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QArrayDataPointer<QHstsPolicy>::needsDetach((QArrayDataPointer<QHstsPolicy> *)in_RDI);
  if (!(bool)uVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar4 = QArrayDataPointer<QHstsPolicy>::freeSpaceAtEnd
                          ((QArrayDataPointer<QHstsPolicy> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar4 != 0)) {
      QArrayDataPointer<QHstsPolicy>::end((QArrayDataPointer<QHstsPolicy> *)in_RDI);
      QHstsPolicy::QHstsPolicy
                ((QHstsPolicy *)in_RDX,
                 (QHstsPolicy *)
                 CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT24(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8))));
      in_RDI->displaceTo = (QHstsPolicy *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_0028d19a;
    }
    if ((in_RSI == (QHstsPolicy *)0x0) &&
       (qVar4 = QArrayDataPointer<QHstsPolicy>::freeSpaceAtBegin
                          ((QArrayDataPointer<QHstsPolicy> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar4 != 0)) {
      QArrayDataPointer<QHstsPolicy>::begin((QArrayDataPointer<QHstsPolicy> *)0x28d074);
      QHstsPolicy::QHstsPolicy
                ((QHstsPolicy *)in_RDX,
                 (QHstsPolicy *)
                 CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT24(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8))));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QHstsPolicy *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_0028d19a;
    }
  }
  QHstsPolicy::QHstsPolicy
            ((QHstsPolicy *)in_RDX,
             (QHstsPolicy *)
             CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                     CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)))
            );
  bVar5 = in_RDI->displaceTo != (QHstsPolicy *)0x0;
  uVar6 = bVar5 && in_RSI == (QHstsPolicy *)0x0;
  uVar3 = (uint)(bVar5 && in_RSI == (QHstsPolicy *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QHstsPolicy>::detachAndGrow
            ((QArrayDataPointer<QHstsPolicy> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QHstsPolicy **)
             CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar3))),
             (QArrayDataPointer<QHstsPolicy> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QHstsPolicy> *)
                              CONCAT17(uVar2,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar3
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QHstsPolicy *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::~Inserter(in_RDI);
  }
  else {
    QArrayDataPointer<QHstsPolicy>::begin((QArrayDataPointer<QHstsPolicy> *)0x28d12e);
    QHstsPolicy::QHstsPolicy
              ((QHstsPolicy *)in_RDX,
               (QHstsPolicy *)
               CONCAT17(uVar2,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar3))));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QHstsPolicy *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  QHstsPolicy::~QHstsPolicy((QHstsPolicy *)0x28d19a);
LAB_0028d19a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }